

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_log.cc
# Opt level: O0

bool __thiscall BuildLog::OpenForWriteIfNeeded(BuildLog *this)

{
  int iVar1;
  ulong uVar2;
  char *__filename;
  FILE *pFVar3;
  long lVar4;
  BuildLog *this_local;
  
  if ((this->log_file_ == (FILE *)0x0) && (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0))
  {
    __filename = (char *)std::__cxx11::string::c_str();
    pFVar3 = fopen(__filename,"ab");
    this->log_file_ = (FILE *)pFVar3;
    if (this->log_file_ == (FILE *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      iVar1 = setvbuf((FILE *)this->log_file_,(char *)0x0,1,0x2000);
      if (iVar1 == 0) {
        iVar1 = fileno((FILE *)this->log_file_);
        SetCloseOnExec(iVar1);
        fseek((FILE *)this->log_file_,0,2);
        lVar4 = ftell((FILE *)this->log_file_);
        if ((lVar4 == 0) &&
           (iVar1 = fprintf((FILE *)this->log_file_,"# ninja log v%d\n",5), iVar1 < 0)) {
          this_local._7_1_ = false;
        }
        else {
          this_local._7_1_ = true;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool BuildLog::OpenForWriteIfNeeded() {
  if (log_file_ || log_file_path_.empty()) {
    return true;
  }
  log_file_ = fopen(log_file_path_.c_str(), "ab");
  if (!log_file_) {
    return false;
  }
  if (setvbuf(log_file_, NULL, _IOLBF, BUFSIZ) != 0) {
    return false;
  }
  SetCloseOnExec(fileno(log_file_));

  // Opening a file in append mode doesn't set the file pointer to the file's
  // end on Windows. Do that explicitly.
  fseek(log_file_, 0, SEEK_END);

  if (ftell(log_file_) == 0) {
    if (fprintf(log_file_, kFileSignature, kCurrentVersion) < 0) {
      return false;
    }
  }
  return true;
}